

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall
FIX::DataDictionary::checkHasRequired
          (DataDictionary *this,FieldMap *header,FieldMap *body,FieldMap *trailer,MsgType *msgType)

{
  string *__k;
  _Rb_tree_color _Var1;
  FieldMap *header_00;
  NonBodyFields *pNVar2;
  DataDictionary *pDVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  RequiredTagMissing *pRVar7;
  _Base_ptr p_Var8;
  int delim;
  DataDictionary *local_58;
  DataDictionary *DD;
  
  p_Var5 = (this->m_headerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = this;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(this->m_headerFields)._M_t._M_impl.super__Rb_tree_header) {
      p_Var5 = (local_58->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pNVar2 = &local_58->m_trailerFields;
      do {
        pDVar3 = local_58;
        if ((_Rb_tree_header *)p_Var5 == &(pNVar2->_M_t)._M_impl.super__Rb_tree_header) {
          __k = &(msgType->super_StringField).super_FieldBase.m_string;
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  ::find(&(local_58->m_requiredFields)._M_t,__k);
          if ((_Rb_tree_header *)cVar6._M_node !=
              &(pDVar3->m_requiredFields)._M_t._M_impl.super__Rb_tree_header) {
            for (p_Var5 = cVar6._M_node[2]._M_right;
                p_Var5 != (_Base_ptr)&cVar6._M_node[2]._M_parent;
                p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
              bVar4 = FieldMap::isSetField(body,p_Var5[1]._M_color);
              if (!bVar4) {
                pRVar7 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
                _Var1 = p_Var5[1]._M_color;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&DD,"",(allocator<char> *)&delim);
                RequiredTagMissing::RequiredTagMissing(pRVar7,_Var1,(string *)&DD);
                __cxa_throw(pRVar7,&RequiredTagMissing::typeinfo,Exception::~Exception);
              }
            }
            for (p_Var5 = (body->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var5 != &(body->m_groups)._M_t._M_impl.super__Rb_tree_header;
                p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
              DD = (DataDictionary *)0x0;
              bVar4 = getGroup(local_58,__k,p_Var5[1]._M_color,&delim,&DD);
              if (bVar4) {
                for (p_Var8 = p_Var5[1]._M_parent; p_Var8 != p_Var5[1]._M_left;
                    p_Var8 = (_Base_ptr)&p_Var8->_M_parent) {
                  header_00 = *(FieldMap **)p_Var8;
                  checkHasRequired(DD,header_00,header_00,header_00,msgType);
                }
              }
            }
          }
          return;
        }
        if (p_Var5[1].field_0x4 == '\x01') {
          bVar4 = FieldMap::isSetField(trailer,p_Var5[1]._M_color);
          if (!bVar4) {
            pRVar7 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
            _Var1 = p_Var5[1]._M_color;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&DD,"",(allocator<char> *)&delim);
            RequiredTagMissing::RequiredTagMissing(pRVar7,_Var1,(string *)&DD);
            __cxa_throw(pRVar7,&RequiredTagMissing::typeinfo,Exception::~Exception);
          }
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while( true );
    }
    if (p_Var5[1].field_0x4 == '\x01') {
      bVar4 = FieldMap::isSetField(header,p_Var5[1]._M_color);
      if (!bVar4) {
        pRVar7 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
        _Var1 = p_Var5[1]._M_color;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&DD,"",(allocator<char> *)&delim);
        RequiredTagMissing::RequiredTagMissing(pRVar7,_Var1,(string *)&DD);
        __cxa_throw(pRVar7,&RequiredTagMissing::typeinfo,Exception::~Exception);
      }
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void checkHasRequired
  ( const FieldMap& header, const FieldMap& body, const FieldMap& trailer,
    const MsgType& msgType ) const
  EXCEPT ( RequiredTagMissing )
  {
    NonBodyFields::const_iterator iNBF;
    for( iNBF = m_headerFields.begin(); iNBF != m_headerFields.end(); ++iNBF )
    {
      if( iNBF->second == true && !header.isSetField(iNBF->first) )
        throw RequiredTagMissing( iNBF->first );
    }

    for( iNBF = m_trailerFields.begin(); iNBF != m_trailerFields.end(); ++iNBF )
    {
      if( iNBF->second == true && !trailer.isSetField(iNBF->first) )
        throw RequiredTagMissing( iNBF->first );
    }

    MsgTypeToField::const_iterator iM
      = m_requiredFields.find( msgType.getString() );
    if ( iM == m_requiredFields.end() ) return ;

    const MsgFields& fields = iM->second;
    MsgFields::const_iterator iF;
    for( iF = fields.begin(); iF != fields.end(); ++iF )
    {
      if( !body.isSetField(*iF) )
        throw RequiredTagMissing( *iF );
    }

    FieldMap::g_const_iterator groups;
    for( groups = body.g_begin(); groups != body.g_end(); ++groups )
    {
      int delim;
      const DataDictionary* DD = 0;
      int field = groups->first;
      if( getGroup( msgType.getValue(), field, delim, DD ) )
      {
        std::vector<FieldMap*>::const_iterator group;
        for( group = groups->second.begin(); group != groups->second.end(); ++group )
          DD->checkHasRequired( **group, **group, **group, msgType );
      }
    }
  }